

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

void luaL_addstring(luaL_Buffer *B,char *s)

{
  size_t sz;
  char *__dest;
  
  sz = strlen(s);
  if (sz != 0) {
    __dest = prepbuffsize(B,sz,-1);
    memcpy(__dest,s,sz);
    B->n = B->n + sz;
  }
  return;
}

Assistant:

LUALIB_API void luaL_addstring (luaL_Buffer *B, const char *s) {
  luaL_addlstring(B, s, strlen(s));
}